

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iteration_benchmark.c
# Opt level: O3

void iterate_using_read(roaring_bitmap_t *bm,uint32_t bufsize)

{
  uint32_t uVar1;
  uint32_t *buf;
  roaring_uint32_iterator_t *it;
  ulong uVar2;
  
  buf = (uint32_t *)malloc((ulong)bufsize << 2);
  it = roaring_iterator_create(bm);
  do {
    uVar1 = roaring_uint32_iterator_read(it,buf,bufsize);
    if (uVar1 != 0) {
      uVar2 = 0;
      do {
        uVar2 = uVar2 + 1;
      } while (uVar1 != uVar2);
    }
  } while (bufsize <= uVar1);
  roaring_uint32_iterator_free(it);
  free(buf);
  return;
}

Assistant:

void iterate_using_read(roaring_bitmap_t* bm, uint32_t bufsize) {
    uint32_t* buffer = malloc(sizeof(uint32_t) * bufsize);
    roaring_uint32_iterator_t* iter = roaring_iterator_create(bm);
    uint64_t sum = 0;
    while (1) {
        uint32_t ret = roaring_uint32_iterator_read(iter, buffer, bufsize);
        for (uint32_t i = 0; i < ret; i++) {
            sum += buffer[i];
        }
        if (ret < bufsize) {
            break;
        }
    }
    roaring_uint32_iterator_free(iter);
    free(buffer);
    *(volatile uint64_t*)(&sum) = sum;
}